

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

bool __thiscall
cmIfFunctionBlocker::Replay
          (cmIfFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  cmMakefile *this_00;
  element_type *peVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  cmake *pcVar8;
  int iVar9;
  _Base_ptr lff;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  MessageType messType;
  cmExecutionStatus status;
  cmListFileBacktrace elseifBT;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileBacktrace elseBT;
  MessageType local_2e4;
  undefined1 local_2e0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_2c8;
  undefined4 local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  long local_2a0;
  undefined1 local_298 [24];
  string local_280;
  _Rb_tree_node_base *local_260;
  _Base_ptr local_258;
  undefined1 local_250 [16];
  _Rb_tree_node_base *local_240;
  _Base_ptr local_238;
  undefined1 local_230 [16];
  _Rb_tree_node_base *local_220;
  _Base_ptr local_218;
  undefined1 local_210 [16];
  _Rb_tree_node_base *local_200;
  _Base_ptr local_1f8;
  undefined1 local_1f0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_1b8;
  cmListFileBacktrace local_1a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_190;
  bool local_170;
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pointer local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  _Rb_tree_node_base *local_128;
  _Base_ptr local_120;
  _Rb_tree_node_base local_118;
  _Rb_tree_node_base local_f8;
  _Rb_tree_node_base local_d0;
  _Base_ptr local_b0;
  _Rb_tree_node_base local_a8;
  _Rb_tree_node_base local_88;
  undefined1 local_60 [32];
  pointer local_40;
  pointer local_38;
  
  lff = (_Base_ptr)
        (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
        _M_impl.super__Vector_impl_data._M_start;
  local_1f0._16_8_ =
       (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (lff != (_Base_ptr)local_1f0._16_8_) {
    this_00 = inStatus->Makefile;
    iVar9 = 0;
    local_298._0_8_ = inStatus;
    do {
      iVar6 = std::__cxx11::string::compare
                        ((char *)&((((shared_ptr<const_cmListFileFunction::Implementation> *)
                                    &lff->_M_color)->
                                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->LowerCaseName);
      iVar7 = std::__cxx11::string::compare
                        ((char *)&((((shared_ptr<const_cmListFileFunction::Implementation> *)
                                    &lff->_M_color)->
                                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->LowerCaseName);
      iVar9 = (iVar9 + (uint)(iVar6 == 0)) - (uint)(iVar7 == 0);
      if (iVar9 == 0) {
        iVar6 = std::__cxx11::string::compare
                          ((char *)&((((shared_ptr<const_cmListFileFunction::Implementation> *)
                                      &lff->_M_color)->
                                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->LowerCaseName);
        if (iVar6 == 0) {
          cmMakefile::GetBacktrace(this_00);
          peVar2 = (((shared_ptr<const_cmListFileFunction::Implementation> *)&lff->_M_color)->
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          pcVar3 = (peVar2->OriginalName)._M_dataplus._M_p;
          local_220 = (_Rb_tree_node_base *)local_210;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar3,pcVar3 + (peVar2->OriginalName)._M_string_length);
          pcVar3 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
          local_200 = (_Rb_tree_node_base *)local_1f0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,pcVar3,
                     pcVar3 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                              _M_string_length);
          local_88._M_left =
               (_Base_ptr)
               ((((shared_ptr<const_cmListFileFunction::Implementation> *)&lff->_M_color)->
                super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->Line;
          local_d0._M_right = &local_a8;
          local_a8._M_left = &local_88;
          if (local_220 == (_Rb_tree_node_base *)local_210) {
            local_a8._M_parent = (_Base_ptr)local_210._8_8_;
          }
          else {
            local_d0._M_right = local_220;
          }
          local_a8._1_7_ = local_210._1_7_;
          local_a8._M_color._0_1_ = local_210[0];
          local_b0 = local_218;
          local_218 = (_Base_ptr)0x0;
          local_210[0] = _S_red;
          if (local_200 == (_Rb_tree_node_base *)local_1f0) {
            local_88._M_parent = (_Base_ptr)local_1f0._8_8_;
          }
          else {
            local_a8._M_left = local_200;
          }
          local_88._1_7_ = local_1f0._1_7_;
          local_88._M_color._0_1_ = local_1f0[0];
          local_a8._M_right = local_1f8;
          local_1f8 = (_Base_ptr)0x0;
          local_1f0[0] = _S_red;
          local_60[0x10] = '\0';
          local_220 = (_Rb_tree_node_base *)local_210;
          local_200 = (_Rb_tree_node_base *)local_1f0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_148,
                     (cmListFileContext *)local_2e0);
          if ((local_60[0x10] == '\x01') &&
             (local_60[0x10] = '\0', local_88._M_right != (_Base_ptr)local_60)) {
            operator_delete(local_88._M_right,local_60._0_8_ + 1);
          }
          if (local_a8._M_left != &local_88) {
            operator_delete(local_a8._M_left,local_88._0_8_ + 1);
          }
          if (local_d0._M_right != &local_a8) {
            operator_delete(local_d0._M_right,local_a8._0_8_ + 1);
          }
          if (local_200 != (_Rb_tree_node_base *)local_1f0) {
            operator_delete(local_200,CONCAT71(local_1f0._1_7_,local_1f0[0]) + 1);
          }
          if (local_220 != (_Rb_tree_node_base *)local_210) {
            operator_delete(local_220,CONCAT71(local_210._1_7_,local_210[0]) + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_);
          }
          bVar5 = this->ElseSeen;
          if (bVar5 == true) {
            pcVar8 = cmMakefile::GetCMakeInstance(this_00);
            local_2e0._0_8_ = local_2e0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2e0,"A duplicate ELSE command was found inside an IF block.",
                       "");
            cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_2e0,
                                (cmListFileBacktrace *)&local_148);
            if ((cmMakefile *)local_2e0._0_8_ != (cmMakefile *)(local_2e0 + 0x10)) {
              operator_delete((void *)local_2e0._0_8_,(ulong)(local_2e0._16_8_ + 1));
            }
            cmSystemTools::s_FatalErrorOccurred = true;
          }
          else {
            bVar1 = this->HasRun;
            this->IsBlocking = bVar1;
            this->HasRun = true;
            this->ElseSeen = true;
            if ((bVar1 == false) &&
               (pcVar8 = cmMakefile::GetCMakeInstance(this_00), pcVar8->Trace == true)) {
              cmMakefile::PrintCommandTrace
                        (this_00,(cmListFileFunction *)lff,(cmListFileBacktrace *)&local_148,Yes);
            }
          }
          if ((pointer)local_148._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
          }
          if (bVar5 != false) {
            return true;
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)&((((shared_ptr<const_cmListFileFunction::Implementation> *)
                                        &lff->_M_color)->
                                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->LowerCaseName);
          if (iVar6 != 0) goto LAB_00283bc5;
          cmMakefile::GetBacktrace(this_00);
          peVar2 = (((shared_ptr<const_cmListFileFunction::Implementation> *)&lff->_M_color)->
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_240 = (_Rb_tree_node_base *)local_230;
          pcVar3 = (peVar2->OriginalName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,pcVar3,pcVar3 + (peVar2->OriginalName)._M_string_length);
          local_260 = (_Rb_tree_node_base *)local_250;
          pcVar3 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_260,pcVar3,
                     pcVar3 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                              _M_string_length);
          local_f8._M_left =
               (_Base_ptr)
               ((((shared_ptr<const_cmListFileFunction::Implementation> *)&lff->_M_color)->
                super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->Line;
          local_128 = &local_118;
          local_118._M_left = &local_f8;
          if (local_240 == (_Rb_tree_node_base *)local_230) {
            local_118._M_parent = (_Base_ptr)local_230._8_8_;
          }
          else {
            local_128 = local_240;
          }
          local_118._1_7_ = local_230._1_7_;
          local_118._M_color._0_1_ = local_230[0];
          local_120 = local_238;
          local_238 = (_Base_ptr)0x0;
          local_230[0] = _S_red;
          if (local_260 == (_Rb_tree_node_base *)local_250) {
            local_f8._M_parent = (_Base_ptr)local_250._8_8_;
          }
          else {
            local_118._M_left = local_260;
          }
          local_f8._1_7_ = local_250._1_7_;
          local_f8._M_color._0_1_ = local_250[0];
          local_118._M_right = local_258;
          local_258 = (_Base_ptr)0x0;
          local_250[0] = _S_red;
          local_d0._M_left._0_1_ = '\0';
          local_260 = (_Rb_tree_node_base *)local_250;
          local_240 = (_Rb_tree_node_base *)local_230;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_298 + 8),
                     (cmListFileContext *)local_2e0);
          if (((char)local_d0._M_left == '\x01') &&
             (local_d0._M_left._0_1_ = '\0', local_f8._M_right != &local_d0)) {
            operator_delete(local_f8._M_right,local_d0._0_8_ + 1);
          }
          if (local_118._M_left != &local_f8) {
            operator_delete(local_118._M_left,local_f8._0_8_ + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118._0_8_ + 1);
          }
          if (local_260 != (_Rb_tree_node_base *)local_250) {
            operator_delete(local_260,CONCAT71(local_250._1_7_,local_250[0]) + 1);
          }
          if (local_240 != (_Rb_tree_node_base *)local_230) {
            operator_delete(local_240,CONCAT71(local_230._1_7_,local_230[0]) + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_);
          }
          if (this->ElseSeen == true) {
            pcVar8 = cmMakefile::GetCMakeInstance(this_00);
            local_2e0._0_8_ = local_2e0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2e0,"An ELSEIF command was found after an ELSE command.","");
            cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_2e0,
                                (cmListFileBacktrace *)(local_298 + 8));
            if ((cmMakefile *)local_2e0._0_8_ != (cmMakefile *)(local_2e0 + 0x10)) {
              operator_delete((void *)local_2e0._0_8_,(ulong)(local_2e0._16_8_ + 1));
            }
            cmSystemTools::s_FatalErrorOccurred = true;
LAB_0028461c:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._16_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return true;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._16_8_);
            return true;
          }
          if (this->HasRun == true) {
            this->IsBlocking = true;
          }
          else {
            pcVar8 = cmMakefile::GetCMakeInstance(this_00);
            if (pcVar8->Trace == true) {
              cmMakefile::PrintCommandTrace
                        (this_00,(cmListFileFunction *)lff,(cmListFileBacktrace *)(local_298 + 8),
                         Yes);
            }
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            local_280._M_string_length = 0;
            local_280.field_2._M_local_buf[0] = '\0';
            local_1b8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1b8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1b8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmMakefile::ExpandArguments
                      (this_00,&((((shared_ptr<const_cmListFileFunction::Implementation> *)
                                  &lff->_M_color)->
                                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->Arguments,&local_1b8);
            local_1a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_298._8_8_;
            local_1a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._16_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_298._16_8_ + 8) =
                     *(_Atomic_word *)(local_298._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_298._16_8_ + 8) =
                     *(_Atomic_word *)(local_298._16_8_ + 8) + 1;
              }
            }
            cmConditionEvaluator::cmConditionEvaluator
                      ((cmConditionEvaluator *)local_2e0,this_00,&local_1a0);
            if (local_1a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            bVar5 = cmConditionEvaluator::IsTrue
                              ((cmConditionEvaluator *)local_2e0,&local_1b8,&local_280,&local_2e4);
            if ((pointer)local_280._M_string_length != (pointer)0x0) {
              cmIfCommandError_abi_cxx11_((string *)local_168,&local_1b8);
              local_148._M_allocated_capacity = local_168._8_8_;
              local_148._8_8_ = local_168._0_8_;
              local_138 = (pointer)local_280._M_string_length;
              local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_280._M_dataplus._M_p;
              views._M_len = 2;
              views._M_array = (iterator)&local_148;
              cmCatViews_abi_cxx11_((string *)(local_1f0 + 0x18),views);
              if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
                operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
              }
              pcVar8 = cmMakefile::GetCMakeInstance(this_00);
              cmake::IssueMessage(pcVar8,local_2e4,(string *)(local_1f0 + 0x18),
                                  (cmListFileBacktrace *)(local_298 + 8));
              if (local_2e4 == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccurred = true;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._24_8_ != &local_1c8) {
                  operator_delete((void *)local_1f0._24_8_,local_1c8._M_allocated_capacity + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._16_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._16_8_);
                }
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector(&local_1b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_280._M_dataplus._M_p != &local_280.field_2) {
                  operator_delete(local_280._M_dataplus._M_p,
                                  CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                           local_280.field_2._M_local_buf[0]) + 1);
                }
                goto LAB_0028461c;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._24_8_ != &local_1c8) {
                operator_delete((void *)local_1f0._24_8_,local_1c8._M_allocated_capacity + 1);
              }
            }
            if (bVar5) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._16_8_);
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,
                              CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                       local_280.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._16_8_);
          }
        }
      }
      else {
LAB_00283bc5:
        if (this->IsBlocking == false) {
          local_2c8._8_6_ = 0x2e726f727265;
          local_2c8._vptr__Sp_counted_base._0_6_ = 0x776f6e6b6e75;
          local_2c8._vptr__Sp_counted_base._6_2_ = 0x206e;
          local_2e0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xe;
          local_2c8._M_weak_count._2_1_ = 0;
          local_2b0._M_allocated_capacity = 0;
          local_2b0._8_8_ = 0;
          local_2a0 = 0;
          local_2b8 = 0;
          local_170 = false;
          local_2e0._0_8_ = this_00;
          local_2e0._8_8_ = &local_2c8;
          cmMakefile::ExecuteCommand
                    (this_00,(cmListFileFunction *)lff,(cmExecutionStatus *)local_2e0,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_190);
          if ((local_170 == true) &&
             (local_170 = false,
             local_190._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_190._M_value + 0x10)
             )) {
            operator_delete((void *)local_190._M_value._M_dataplus._M_p,local_190._16_8_ + 1);
          }
          if ((char)local_2b8 == '\x01') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_60 + 0x18),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2b0);
            uVar4 = local_298._0_8_;
            local_148._M_allocated_capacity =
                 (size_type)
                 (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_298._0_8_ + 0x30))->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
            local_148._8_8_ = *(pointer *)(local_298._0_8_ + 0x38);
            local_138 = *(pointer *)(local_298._0_8_ + 0x40);
            (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298._0_8_ + 0x30))->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)local_60._24_8_;
            *(pointer *)(local_298._0_8_ + 0x38) = local_40;
            *(pointer *)(local_298._0_8_ + 0x40) = local_38;
            local_60._24_8_ = (_Base_ptr)0x0;
            local_40 = (pointer)0x0;
            local_38 = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_148);
            *(bool *)(uVar4 + 0x28) = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_60 + 0x18));
LAB_00284580:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_2b0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ == &local_2c8) {
              return true;
            }
            operator_delete((void *)local_2e0._8_8_,
                            CONCAT26(local_2c8._vptr__Sp_counted_base._6_2_,
                                     local_2c8._vptr__Sp_counted_base._0_6_) + 1);
            return true;
          }
          if (local_2b8._1_1_ == '\x01') {
            *(bool *)(local_298._0_8_ + 0x29) = true;
            goto LAB_00284580;
          }
          if (local_2b8._2_1_ == '\x01') {
            *(bool *)(local_298._0_8_ + 0x2a) = true;
            goto LAB_00284580;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2b0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ != &local_2c8) {
            operator_delete((void *)local_2e0._8_8_,
                            CONCAT26(local_2c8._vptr__Sp_counted_base._6_2_,
                                     local_2c8._vptr__Sp_counted_base._0_6_) + 1);
          }
        }
      }
      lff = (_Base_ptr)&lff->_M_left;
    } while (lff != (_Base_ptr)local_1f0._16_8_);
  }
  return true;
}

Assistant:

bool cmIfFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                 cmExecutionStatus& inStatus)
{
  cmMakefile& mf = inStatus.GetMakefile();
  // execute the functions for the true parts of the if statement
  int scopeDepth = 0;
  for (cmListFileFunction const& func : functions) {
    // keep track of scope depth
    if (func.LowerCaseName() == "if") {
      scopeDepth++;
    }
    if (func.LowerCaseName() == "endif") {
      scopeDepth--;
    }
    // watch for our state change
    if (scopeDepth == 0 && func.LowerCaseName() == "else") {
      cmListFileBacktrace elseBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });

      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "A duplicate ELSE command was found inside an IF block.", elseBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      this->IsBlocking = this->HasRun;
      this->HasRun = true;
      this->ElseSeen = true;

      // if trace is enabled, print a (trivially) evaluated "else"
      // statement
      if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
        mf.PrintCommandTrace(func, elseBT,
                             cmMakefile::CommandMissingFromStack::Yes);
      }
    } else if (scopeDepth == 0 && func.LowerCaseName() == "elseif") {
      cmListFileBacktrace elseifBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });
      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "An ELSEIF command was found after an ELSE command.", elseifBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      if (this->HasRun) {
        this->IsBlocking = true;
      } else {
        // if trace is enabled, print the evaluated "elseif" statement
        if (mf.GetCMakeInstance()->GetTrace()) {
          mf.PrintCommandTrace(func, elseifBT,
                               cmMakefile::CommandMissingFromStack::Yes);
        }

        std::string errorString;

        std::vector<cmExpandedCommandArgument> expandedArguments;
        mf.ExpandArguments(func.Arguments(), expandedArguments);

        MessageType messType;

        cmConditionEvaluator conditionEvaluator(mf, elseifBT);

        bool isTrue =
          conditionEvaluator.IsTrue(expandedArguments, errorString, messType);

        if (!errorString.empty()) {
          std::string err =
            cmStrCat(cmIfCommandError(expandedArguments), errorString);
          mf.GetCMakeInstance()->IssueMessage(messType, err, elseifBT);
          if (messType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccurred();
            return true;
          }
        }

        if (isTrue) {
          this->IsBlocking = false;
          this->HasRun = true;
        }
      }
    }

    // should we execute?
    else if (!this->IsBlocking) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(func, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        inStatus.SetBreakInvoked();
        return true;
      }
      if (status.GetContinueInvoked()) {
        inStatus.SetContinueInvoked();
        return true;
      }
    }
  }
  return true;
}